

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_5e684a::TLL::HandleLibrary
          (TLL *this,ProcessingState currentProcessingState,string *lib,cmTargetLinkLibraryType llt)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmMakefile *pcVar2;
  cmTarget *this_00;
  MessageType t;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  cmListFileContext *lfc;
  ostream *poVar6;
  string *psVar7;
  cmGlobalGenerator *this_01;
  size_type sVar8;
  cmake *this_02;
  PolicyID extraout_EDX;
  PolicyID id;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID id_00;
  bool local_6f1;
  cmValue local_6c8;
  cmAlphaNum local_6c0;
  cmAlphaNum local_690;
  string local_660;
  string *local_640;
  string *dc_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string local_618;
  cmAlphaNum local_5f8;
  cmAlphaNum local_5c8;
  string local_598;
  string *local_578;
  string *dc;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  undefined1 local_518 [4];
  PolicyStatus policy22Status;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  undefined1 local_468 [8];
  string configLib;
  string local_418;
  cmAlphaNum local_3f8;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  cmAlphaNum local_380;
  cmAlphaNum local_350;
  string local_320;
  cmTarget *local_300;
  cmTarget *tgt;
  cmAlphaNum local_2c8;
  string local_298;
  int local_274;
  string local_270;
  char *local_250;
  char *existingSig;
  MessageType local_224;
  char *pcStack_220;
  MessageType messageType;
  char *modal;
  ostringstream e;
  undefined1 local_a0 [24];
  TLLSignature sig;
  allocator<char> local_51;
  string local_50;
  cmTargetLinkLibraryType local_2c;
  string *psStack_28;
  cmTargetLinkLibraryType llt_local;
  string *lib_local;
  TLL *pTStack_18;
  ProcessingState currentProcessingState_local;
  TLL *this_local;
  
  local_2c = llt;
  psStack_28 = lib;
  lib_local._4_4_ = currentProcessingState;
  pTStack_18 = this;
  TVar4 = cmTarget::GetType(this->Target);
  if ((TVar4 == INTERFACE_LIBRARY) && (lib_local._4_4_ != ProcessingKeywordLinkInterface)) {
    pcVar2 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,&local_51);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    this_local._7_1_ = 0;
    goto LAB_00373b5c;
  }
  bVar3 = cmTarget::IsImported(this->Target);
  if ((bVar3) && (lib_local._4_4_ != ProcessingKeywordLinkInterface)) {
    pcVar2 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sig,
               "IMPORTED library can only be used with the INTERFACE keyword of target_link_libraries"
               ,(allocator<char> *)(local_a0 + 0x17));
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&sig);
    std::__cxx11::string::~string((string *)&sig);
    std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0x17));
    this_local._7_1_ = 0;
    goto LAB_00373b5c;
  }
  local_6f1 = true;
  if ((((lib_local._4_4_ != ProcessingPlainPrivateInterface) &&
       (local_6f1 = true, lib_local._4_4_ != ProcessingPlainPublicInterface)) &&
      (local_6f1 = true, lib_local._4_4_ != ProcessingKeywordPrivateInterface)) &&
     (local_6f1 = true, lib_local._4_4_ != ProcessingKeywordPublicInterface)) {
    local_6f1 = lib_local._4_4_ == ProcessingKeywordLinkInterface;
  }
  this_00 = this->Target;
  local_a0._16_4_ = (byte)~local_6f1 & PlainTLLSignature;
  cmMakefile::GetBacktrace((cmMakefile *)local_a0);
  lfc = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_a0);
  bVar3 = cmTarget::PushTLLCommandTrace(this_00,(byte)~local_6f1 & PlainTLLSignature,lfc);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_a0);
  id_00 = extraout_EDX;
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_220 = (char *)0x0;
    local_224 = AUTHOR_WARNING;
    PVar5 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0023,false);
    if (PVar5 != OLD) {
      if (PVar5 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&existingSig,(cmPolicies *)0x17,id);
        poVar6 = std::operator<<((ostream *)&modal,(string *)&existingSig);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&existingSig);
        pcStack_220 = "should";
      }
      else if (PVar5 - NEW < 3) {
        pcStack_220 = "must";
        local_224 = FATAL_ERROR;
      }
    }
    if (pcStack_220 == (char *)0x0) {
LAB_00373032:
      local_274 = 0;
    }
    else {
      local_250 = "keyword";
      if (local_a0._16_4_ == KeywordTLLSignature) {
        local_250 = "plain";
      }
      poVar6 = std::operator<<((ostream *)&modal,"The ");
      poVar6 = std::operator<<(poVar6,local_250);
      poVar6 = std::operator<<(poVar6,
                               " signature for target_link_libraries has already been used with the target \""
                              );
      psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      poVar6 = std::operator<<(poVar6,"\".  All uses of target_link_libraries with a target ");
      poVar6 = std::operator<<(poVar6,pcStack_220);
      std::operator<<(poVar6," be either all-keyword or all-plain.\n");
      cmTarget::GetTllSignatureTraces
                (this->Target,(ostream *)&modal,(uint)(local_a0._16_4_ == KeywordTLLSignature));
      t = local_224;
      pcVar2 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar2,t,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      if (local_224 != FATAL_ERROR) goto LAB_00373032;
      this_local._7_1_ = 0;
      local_274 = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
    id_00 = extraout_EDX_00;
    if (local_274 != 0) goto LAB_00373b5c;
  }
  if ((lib_local._4_4_ != ProcessingKeywordLinkInterface) &&
     (lib_local._4_4_ != ProcessingPlainLinkInterface)) {
    if ((this->RejectRemoteLinking & 1U) != 0) {
      pcVar2 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_2c8,"Attempt to add link library \"");
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&tgt,psStack_28);
      psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
      cmStrCat<char[14],std::__cxx11::string,char[96]>
                (&local_298,&local_2c8,(cmAlphaNum *)&tgt,(char (*) [14])"\" to target \"",psVar7,
                 (char (*) [96])
                 "\" which is not built in this directory.\nThis is allowed only when policy CMP0079 is set to NEW."
                );
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      this_local._7_1_ = 0;
      goto LAB_00373b5c;
    }
    this_01 = cmMakefile::GetGlobalGenerator(this->Makefile);
    local_300 = cmGlobalGenerator::FindTarget(this_01,psStack_28,false);
    if ((((local_300 != (cmTarget *)0x0) &&
         (TVar4 = cmTarget::GetType(local_300), TVar4 != STATIC_LIBRARY)) &&
        ((TVar4 = cmTarget::GetType(local_300), TVar4 != SHARED_LIBRARY &&
         (((TVar4 = cmTarget::GetType(local_300), TVar4 != UNKNOWN_LIBRARY &&
           (TVar4 = cmTarget::GetType(local_300), TVar4 != OBJECT_LIBRARY)) &&
          (TVar4 = cmTarget::GetType(local_300), TVar4 != INTERFACE_LIBRARY)))))) &&
       (bVar3 = cmTarget::IsExecutableWithExports(local_300), !bVar3)) {
      pcVar2 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_350,"Target \"");
      cmAlphaNum::cmAlphaNum(&local_380,psStack_28);
      TVar4 = cmTarget::GetType(local_300);
      psVar7 = cmState::GetTargetTypeName_abi_cxx11_(TVar4);
      cmStrCat<char[11],std::__cxx11::string,char[115],char[50]>
                (&local_320,&local_350,&local_380,(char (*) [11])"\" of type ",psVar7,
                 (char (*) [115])
                 " may not be linked into another target. One may link only to INTERFACE, OBJECT, STATIC or SHARED libraries, or to "
                 ,(char (*) [50])0xbd8ab1);
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"LINK_LIBRARIES",&local_3a1);
    AffectsProperty(this,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
    cmTarget::AddLinkLibrary(this->Target,this->Makefile,psStack_28,local_2c);
    id_00 = extraout_EDX_01;
  }
  if ((this->WarnRemoteInterface & 1U) != 0) {
    pcVar2 = this->Makefile;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_418,(cmPolicies *)0x4f,id_00);
    cmAlphaNum::cmAlphaNum(&local_3f8,&local_418);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&configLib.field_2 + 8),"\nTarget\n  ");
    psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<std::__cxx11::string,char[100],std::__cxx11::string,char[107]>
              (&local_3c8,&local_3f8,(cmAlphaNum *)((long)&configLib.field_2 + 8),psVar7,
               (char (*) [100])
               "\nis not created in this directory.  For compatibility with older versions of CMake, link library\n  "
               ,psStack_28,
               (char (*) [107])
               "\nwill be looked up in the directory in which the target was created rather than in this calling directory."
              );
    cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_418);
  }
  if ((lib_local._4_4_ == ProcessingKeywordPrivateInterface) ||
     (lib_local._4_4_ == ProcessingPlainPrivateInterface)) {
    TVar4 = cmTarget::GetType(this->Target);
    if ((TVar4 == STATIC_LIBRARY) ||
       (TVar4 = cmTarget::GetType(this->Target), TVar4 == OBJECT_LIBRARY)) {
      cmTarget::GetDebugGeneratorExpressions((string *)local_468,this->Target,psStack_28,local_2c);
      bVar3 = cmGeneratorExpression::IsValidTargetName(psStack_28);
      if ((bVar3) || (sVar8 = cmGeneratorExpression::Find(psStack_28), sVar8 != 0xffffffffffffffff))
      {
        std::operator+(&local_4a8,"$<LINK_ONLY:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_468);
        std::operator+(&local_488,&local_4a8,">");
        std::__cxx11::string::operator=((string *)local_468,(string *)&local_488);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c8,"INTERFACE_LINK_LIBRARIES",&local_4c9);
      AppendProperty(this,&local_4c8,(string *)local_468);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
      std::__cxx11::string::~string((string *)local_468);
    }
    this_local._7_1_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,"INTERFACE_LINK_LIBRARIES",&local_4f1);
    cmTarget::GetDebugGeneratorExpressions((string *)local_518,this->Target,psStack_28,local_2c);
    AppendProperty(this,&local_4f0,(string *)local_518);
    std::__cxx11::string::~string((string *)local_518);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    if (lib_local._4_4_ == ProcessingLinkLibraries) {
      this_local._7_1_ = 1;
    }
    else {
      PVar5 = cmTarget::GetPolicyStatusCMP0022(this->Target);
      if ((PVar5 == OLD) || (PVar5 == WARN)) {
        TVar4 = cmTarget::GetType(this->Target);
        if (TVar4 == INTERFACE_LIBRARY) {
          this_local._7_1_ = 1;
        }
        else {
          this_02 = cmMakefile::GetCMakeInstance(this->Makefile);
          cmake::GetDebugConfigs_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8),this_02);
          std::__cxx11::string::string((string *)&__range3);
          if ((local_2c == DEBUG_LibraryType) || (local_2c == GENERAL_LibraryType)) {
            pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8);
            __end3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(pvVar1);
            dc = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar1);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&dc), bVar3) {
              local_578 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end3);
              cmAlphaNum::cmAlphaNum(&local_5c8,"LINK_INTERFACE_LIBRARIES_");
              cmAlphaNum::cmAlphaNum(&local_5f8,local_578);
              cmStrCat<>(&local_598,&local_5c8,&local_5f8);
              std::__cxx11::string::operator=((string *)&__range3,(string *)&local_598);
              std::__cxx11::string::~string((string *)&local_598);
              AppendProperty(this,(string *)&__range3,psStack_28);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end3);
            }
          }
          if ((local_2c == OPTIMIZED_LibraryType) || (local_2c == GENERAL_LibraryType)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_618,"LINK_INTERFACE_LIBRARIES",
                       (allocator<char> *)((long)&__range3_1 + 7));
            AppendProperty(this,&local_618,psStack_28);
            std::__cxx11::string::~string((string *)&local_618);
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
            pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8);
            __end3_1 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(pvVar1);
            dc_1 = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(pvVar1);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end3_1,
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&dc_1), bVar3) {
              local_640 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end3_1);
              cmAlphaNum::cmAlphaNum(&local_690,"LINK_INTERFACE_LIBRARIES_");
              cmAlphaNum::cmAlphaNum(&local_6c0,local_640);
              cmStrCat<>(&local_660,&local_690,&local_6c0);
              std::__cxx11::string::operator=((string *)&__range3,(string *)&local_660);
              std::__cxx11::string::~string((string *)&local_660);
              local_6c8 = cmTarget::GetProperty(this->Target,(string *)&__range3);
              bVar3 = cmValue::operator_cast_to_bool(&local_6c8);
              if (((bVar3 ^ 0xffU) & 1) != 0) {
                cmTarget::SetProperty(this->Target,(string *)&__range3,"");
              }
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end3_1);
            }
          }
          std::__cxx11::string::~string((string *)&__range3);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&prop.field_2 + 8));
          this_local._7_1_ = 1;
        }
      }
      else {
        this_local._7_1_ = 1;
      }
    }
  }
LAB_00373b5c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TLL::HandleLibrary(ProcessingState currentProcessingState,
                        const std::string& lib, cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }
  if (this->Target->IsImported() &&
      currentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      "IMPORTED library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (currentProcessingState == ProcessingPlainPrivateInterface ||
     currentProcessingState == ProcessingPlainPublicInterface ||
     currentProcessingState == ProcessingKeywordPrivateInterface ||
     currentProcessingState == ProcessingKeywordPublicInterface ||
     currentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile.GetBacktrace().Top())) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile.GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig
        << " signature for target_link_libraries has "
           "already been used with the target \""
        << this->Target->GetName()
        << "\".  All uses of target_link_libraries with a target " << modal
        << " be either all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Handle normal case where the command was called with another keyword than
  // INTERFACE / LINK_INTERFACE_LIBRARIES or none at all. (The "LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  if (currentProcessingState != ProcessingKeywordLinkInterface &&
      currentProcessingState != ProcessingPlainLinkInterface) {

    if (this->RejectRemoteLinking) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Attempt to add link library \"", lib, "\" to target \"",
                 this->Target->GetName(),
                 "\" which is not built in this "
                 "directory.\nThis is allowed only when policy CMP0079 "
                 "is set to NEW."));
      return false;
    }

    cmTarget* tgt = this->Makefile.GetGlobalGenerator()->FindTarget(lib);

    if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::UNKNOWN_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
        !tgt->IsExecutableWithExports()) {
      this->Makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(
          "Target \"", lib, "\" of type ",
          cmState::GetTargetTypeName(tgt->GetType()),
          " may not be linked into another target. One may link only to "
          "INTERFACE, OBJECT, STATIC or SHARED libraries, or to ",
          "executables with the ENABLE_EXPORTS property set."));
    }

    this->AffectsProperty("LINK_LIBRARIES");
    this->Target->AddLinkLibrary(this->Makefile, lib, llt);
  }

  if (this->WarnRemoteInterface) {
    this->Makefile.IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0079), "\nTarget\n  ",
        this->Target->GetName(),
        "\nis not created in this "
        "directory.  For compatibility with older versions of CMake, link "
        "library\n  ",
        lib,
        "\nwill be looked up in the directory in which "
        "the target was created rather than in this calling directory."));
  }

  // Handle (additional) case where the command was called with PRIVATE /
  // LINK_PRIVATE and stop its processing. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall only be populated if it is a
  // STATIC library.)
  if (currentProcessingState == ProcessingKeywordPrivateInterface ||
      currentProcessingState == ProcessingPlainPrivateInterface) {
    if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      std::string configLib =
        this->Target->GetDebugGeneratorExpressions(lib, llt);
      if (cmGeneratorExpression::IsValidTargetName(lib) ||
          cmGeneratorExpression::Find(lib) != std::string::npos) {
        configLib = "$<LINK_ONLY:" + configLib + ">";
      }
      this->AppendProperty("INTERFACE_LINK_LIBRARIES", configLib);
    }
    return true;
  }

  // Handle general case where the command was called with another keyword than
  // PRIVATE / LINK_PRIVATE or none at all. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  this->AppendProperty("INTERFACE_LINK_LIBRARIES",
                       this->Target->GetDebugGeneratorExpressions(lib, llt));

  // Stop processing if called without any keyword.
  if (currentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  // Stop processing if policy CMP0022 is set to NEW.
  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();
  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }
  // Stop processing if called with an INTERFACE library on the LHS.
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Handle (additional) backward-compatibility case where the command was
  // called with PUBLIC / INTERFACE / LINK_PUBLIC / LINK_INTERFACE_LIBRARIES.
  // (The policy CMP0022 is not set to NEW.)
  {
    // Get the list of configurations considered to be DEBUG.
    std::vector<std::string> debugConfigs =
      this->Makefile.GetCMakeInstance()->GetDebugConfigs();
    std::string prop;

    // Include this library in the link interface for the target.
    if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the DEBUG configuration interfaces.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        this->AppendProperty(prop, lib);
      }
    }
    if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the non-DEBUG configuration interfaces.
      this->AppendProperty("LINK_INTERFACE_LIBRARIES", lib);

      // Make sure the DEBUG configuration interfaces exist so that the
      // general one will not be used as a fall-back.
      for (std::string const& dc : debugConfigs) {
        prop = cmStrCat("LINK_INTERFACE_LIBRARIES_", dc);
        if (!this->Target->GetProperty(prop)) {
          this->Target->SetProperty(prop, "");
        }
      }
    }
  }
  return true;
}